

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O0

void anon_unknown.dwarf_8c5f0a::on_directory_change
               (uv_fs_event_t *handle,char *filename,int events,int status)

{
  char *local_68;
  allocator local_49;
  string local_48 [8];
  string pathSegment;
  cmIBaseWatcher *watcher;
  int status_local;
  int events_local;
  char *filename_local;
  uv_fs_event_t *handle_local;
  
  pathSegment.field_2._8_8_ = handle->data;
  local_68 = filename;
  if (filename == (char *)0x0) {
    local_68 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,local_68,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  (**(code **)(*(long *)pathSegment.field_2._8_8_ + 0x10))
            (pathSegment.field_2._8_8_,local_48,events,status);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void on_directory_change(uv_fs_event_t* handle, const char* filename,
                         int events, int status)
{
  const cmIBaseWatcher* const watcher =
    static_cast<const cmIBaseWatcher*>(handle->data);
  const std::string pathSegment(filename ? filename : "");
  watcher->Trigger(pathSegment, events, status);
}